

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall FIX::double_conversion::Bignum::BigitsShiftLeft(Bignum *this,int shift_amount)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  int local_1c;
  Chunk new_carry;
  int i;
  Chunk carry;
  int shift_amount_local;
  Bignum *this_local;
  
  if (0x1b < shift_amount) {
    __assert_fail("shift_amount < kBigitSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x2d3,"void FIX::double_conversion::Bignum::BigitsShiftLeft(int)");
  }
  if (-1 < shift_amount) {
    new_carry = 0;
    for (local_1c = 0; local_1c < this->used_digits_; local_1c = local_1c + 1) {
      puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,local_1c);
      uVar1 = *puVar3;
      puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,local_1c);
      uVar2 = *puVar3;
      puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,local_1c);
      *puVar3 = (uVar2 << ((byte)shift_amount & 0x1f)) + new_carry & 0xfffffff;
      new_carry = uVar1 >> (0x1c - (byte)shift_amount & 0x1f);
    }
    if (new_carry != 0) {
      puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,this->used_digits_);
      *puVar3 = new_carry;
      this->used_digits_ = this->used_digits_ + 1;
    }
    return;
  }
  __assert_fail("shift_amount >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                ,0x2d4,"void FIX::double_conversion::Bignum::BigitsShiftLeft(int)");
}

Assistant:

void Bignum::BigitsShiftLeft(int shift_amount) {
  ASSERT(shift_amount < kBigitSize);
  ASSERT(shift_amount >= 0);
  Chunk carry = 0;
  for (int i = 0; i < used_digits_; ++i) {
    Chunk new_carry = bigits_[i] >> (kBigitSize - shift_amount);
    bigits_[i] = ((bigits_[i] << shift_amount) + carry) & kBigitMask;
    carry = new_carry;
  }
  if (carry != 0) {
    bigits_[used_digits_] = carry;
    used_digits_++;
  }
}